

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

PsbtSignatureDataStruct * __thiscall
cfd::api::json::PsbtSignatureData::ConvertToStruct
          (PsbtSignatureDataStruct *__return_storage_ptr__,PsbtSignatureData *this)

{
  _Rb_tree_header *p_Var1;
  
  (__return_storage_ptr__->pubkey)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pubkey).field_2;
  (__return_storage_ptr__->pubkey)._M_string_length = 0;
  (__return_storage_ptr__->pubkey).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->signature)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->signature).field_2;
  (__return_storage_ptr__->signature)._M_string_length = 0;
  (__return_storage_ptr__->signature).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->signature);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

PsbtSignatureDataStruct PsbtSignatureData::ConvertToStruct() const {  // NOLINT
  PsbtSignatureDataStruct result;
  result.pubkey = pubkey_;
  result.signature = signature_;
  result.ignore_items = ignore_items;
  return result;
}